

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::GetCatchCount(TypeChecker *this,Index depth,Index *out_count)

{
  bool bVar1;
  Result result;
  size_type sVar2;
  reference pvVar3;
  uint local_3c;
  LabelType type;
  Index idx;
  Index catch_count;
  Label *unused;
  Index *out_count_local;
  TypeChecker *pTStack_18;
  Index depth_local;
  TypeChecker *this_local;
  
  unused = (Label *)out_count;
  out_count_local._4_4_ = depth;
  pTStack_18 = this;
  result = GetLabel(this,depth,(Label **)&catch_count);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    type = First;
    for (local_3c = 0; local_3c <= out_count_local._4_4_; local_3c = local_3c + 1) {
      sVar2 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::size
                        (&this->label_stack_);
      pvVar3 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::
               operator[](&this->label_stack_,(sVar2 - local_3c) - 1);
      if (pvVar3->label_type == Catch) {
        type = type + InitExpr;
      }
    }
    unused->label_type = type;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::GetCatchCount(Index depth, Index* out_count) {
  Label* unused;
  if (Failed(GetLabel(depth, &unused))) {
    return Result::Error;
  }

  Index catch_count = 0;
  for (Index idx = 0; idx <= depth; idx++) {
    LabelType type = label_stack_[label_stack_.size() - idx - 1].label_type;
    if (type == LabelType::Catch) {
      catch_count++;
    }
  }
  *out_count = catch_count;

  return Result::Ok;
}